

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O1

void * flatcc_emitter_copy_buffer(flatcc_emitter_t *E,void *buf,size_t size)

{
  void *pvVar1;
  flatcc_emitter_page_t *__src;
  ulong __n;
  size_t __n_00;
  
  __n = E->used;
  if ((__n <= size) && (E->front != (flatcc_emitter_page_t *)0x0)) {
    if (E->front == E->back) {
      __src = (flatcc_emitter_page_t *)E->front_cursor;
    }
    else {
      __n_00 = 0xb80 - E->front_left;
      memcpy(buf,E->front_cursor,__n_00);
      buf = (void *)(__n_00 + (long)buf);
      for (__src = E->front->next; __src != E->back; __src = __src->next) {
        memcpy(buf,__src,0xb80);
        buf = (void *)((long)buf + 0xb80);
      }
      __n = 0xb80 - E->back_left;
    }
    pvVar1 = memcpy(buf,__src,__n);
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

void *flatcc_emitter_copy_buffer(flatcc_emitter_t *E, void *buf, size_t size)
{
    flatcc_emitter_page_t *p;
    size_t len;

    if (size < E->used) {
        return 0;
    }
    if (!E->front) {
        return 0;
    }
    if (E->front == E->back) {
        memcpy(buf, E->front_cursor, E->used);
        return buf;
    }
    len = FLATCC_EMITTER_PAGE_SIZE - E->front_left;
    memcpy(buf, E->front_cursor, len);
    buf = (uint8_t *)buf + len;
    p = E->front->next;
    while (p != E->back) {
        memcpy(buf, p->page, FLATCC_EMITTER_PAGE_SIZE);
        buf = (uint8_t *)buf + FLATCC_EMITTER_PAGE_SIZE;
        p = p->next;
    }
    memcpy(buf, p->page, FLATCC_EMITTER_PAGE_SIZE - E->back_left);
    return buf;
}